

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

int read_restr_substmt(lys_module *module,lys_restr *restr,lyxml_elem *yin,unres_schema *unres)

{
  lyxml_elem *plVar1;
  int iVar2;
  char *pcVar3;
  char *value;
  lyxml_elem *next;
  lyxml_elem *child;
  unres_schema *unres_local;
  lyxml_elem *yin_local;
  lys_restr *restr_local;
  lys_module *module_local;
  
  plVar1 = yin->child;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            do {
              next = plVar1;
              if (next == (lyxml_elem *)0x0) {
                return 0;
              }
              plVar1 = next->next;
            } while (next->ns == (lyxml_ns *)0x0);
            iVar2 = strcmp(next->ns->value,"urn:ietf:params:xml:ns:yang:yin:1");
            if (iVar2 == 0) break;
            iVar2 = lyp_yin_parse_subnode_ext
                              (module,restr,LYEXT_PAR_RESTR,next,LYEXT_SUBSTMT_SELF,'\0',unres);
            if (iVar2 != 0) {
              return 1;
            }
          }
          iVar2 = strcmp(next->name,"description");
          if (iVar2 != 0) break;
          if (restr->dsc != (char *)0x0) {
            ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,next->name,yin->name);
            return 1;
          }
          iVar2 = lyp_yin_parse_subnode_ext
                            (module,restr,LYEXT_PAR_RESTR,next,LYEXT_SUBSTMT_DESCRIPTION,'\0',unres)
          ;
          if (iVar2 != 0) {
            return 1;
          }
          pcVar3 = read_yin_subnode(module->ctx,next,"text");
          restr->dsc = pcVar3;
          if (restr->dsc == (char *)0x0) {
            return 1;
          }
        }
        iVar2 = strcmp(next->name,"reference");
        if (iVar2 != 0) break;
        if (restr->ref != (char *)0x0) {
          ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,next->name,yin->name);
          return 1;
        }
        iVar2 = lyp_yin_parse_subnode_ext
                          (module,restr,LYEXT_PAR_RESTR,next,LYEXT_SUBSTMT_REFERENCE,'\0',unres);
        if (iVar2 != 0) {
          return 1;
        }
        pcVar3 = read_yin_subnode(module->ctx,next,"text");
        restr->ref = pcVar3;
        if (restr->ref == (char *)0x0) {
          return 1;
        }
      }
      iVar2 = strcmp(next->name,"error-app-tag");
      if (iVar2 != 0) break;
      if (restr->eapptag != (char *)0x0) {
        ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,next->name,yin->name);
        return 1;
      }
      iVar2 = lyp_yin_parse_subnode_ext
                        (module,restr,LYEXT_PAR_RESTR,next,LYEXT_SUBSTMT_ERRTAG,'\0',unres);
      if (iVar2 != 0) {
        return 1;
      }
      pcVar3 = lyxml_get_attr(next,"value",(char *)0x0);
      if (pcVar3 == (char *)0x0) {
        ly_vlog(LYE_MISSARG,LY_VLOG_NONE,(void *)0x0,"value",next->name);
        return 1;
      }
      pcVar3 = lydict_insert(module->ctx,pcVar3,0);
      restr->eapptag = pcVar3;
    }
    iVar2 = strcmp(next->name,"error-message");
    if (iVar2 != 0) {
      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,next->name);
      return 1;
    }
    if (restr->emsg != (char *)0x0) {
      ly_vlog(LYE_TOOMANY,LY_VLOG_NONE,(void *)0x0,next->name,yin->name);
      return 1;
    }
    iVar2 = lyp_yin_parse_subnode_ext
                      (module,restr,LYEXT_PAR_RESTR,next,LYEXT_SUBSTMT_ERRMSG,'\0',unres);
    if (iVar2 != 0) {
      return 1;
    }
    pcVar3 = read_yin_subnode(module->ctx,next,"value");
    restr->emsg = pcVar3;
  } while (restr->emsg != (char *)0x0);
  return 1;
}

Assistant:

static int
read_restr_substmt(struct lys_module *module, struct lys_restr *restr, struct lyxml_elem *yin,
                   struct unres_schema *unres)
{
    struct lyxml_elem *child, *next;
    const char *value;

    LY_TREE_FOR_SAFE(yin->child, next, child) {
        if (!child->ns) {
            /* garbage */
            continue;
        } else if (strcmp(child->ns->value, LY_NSYIN)) {
            /* extension */
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_SELF, 0, unres)) {
                return EXIT_FAILURE;
            }
        } else if (!strcmp(child->name, "description")) {
            if (restr->dsc) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, child->name, yin->name);
                return EXIT_FAILURE;
            }
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_DESCRIPTION, 0, unres)) {
                return EXIT_FAILURE;
            }
            restr->dsc = read_yin_subnode(module->ctx, child, "text");
            if (!restr->dsc) {
                return EXIT_FAILURE;
            }
        } else if (!strcmp(child->name, "reference")) {
            if (restr->ref) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, child->name, yin->name);
                return EXIT_FAILURE;
            }
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_REFERENCE, 0, unres)) {
                return EXIT_FAILURE;
            }
            restr->ref = read_yin_subnode(module->ctx, child, "text");
            if (!restr->ref) {
                return EXIT_FAILURE;
            }
        } else if (!strcmp(child->name, "error-app-tag")) {
            if (restr->eapptag) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, child->name, yin->name);
                return EXIT_FAILURE;
            }
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_ERRTAG, 0, unres)) {
                return EXIT_FAILURE;
            }
            GETVAL(value, child, "value");
            restr->eapptag = lydict_insert(module->ctx, value, 0);
        } else if (!strcmp(child->name, "error-message")) {
            if (restr->emsg) {
                LOGVAL(LYE_TOOMANY, LY_VLOG_NONE, NULL, child->name, yin->name);
                return EXIT_FAILURE;
            }
            if (lyp_yin_parse_subnode_ext(module, restr, LYEXT_PAR_RESTR, child, LYEXT_SUBSTMT_ERRMSG, 0, unres)) {
                return EXIT_FAILURE;
            }
            restr->emsg = read_yin_subnode(module->ctx, child, "value");
            if (!restr->emsg) {
                return EXIT_FAILURE;
            }
        } else {
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, child->name);
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;

error:
    return EXIT_FAILURE;
}